

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  size_type *psVar6;
  
  iVar5 = fLI::FLAGS_v;
  sVar3 = strlen(module_pattern);
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)vmodule_lock);
  bVar2 = false;
  psVar6 = (size_type *)&vmodule_list;
  while (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar6,
        __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = std::operator==(__lhs,module_pattern);
    if (bVar1) {
      if (!bVar2) {
        iVar5 = *(int *)&__lhs[1]._M_dataplus._M_p;
        bVar2 = true;
      }
      *(int *)&__lhs[1]._M_dataplus._M_p = log_level;
    }
    else if ((!bVar2) &&
            (bVar1 = glog_internal_namespace_::SafeFNMatch_
                               ((__lhs->_M_dataplus)._M_p,__lhs->_M_string_length,module_pattern,
                                (long)(int)sVar3), bVar1)) {
      iVar5 = *(int *)&__lhs[1]._M_dataplus._M_p;
      bVar2 = true;
    }
    psVar6 = &__lhs[1]._M_string_length;
  }
  if (!bVar2) {
    pcVar4 = (char *)operator_new(0x30);
    *(char **)pcVar4 = pcVar4 + 0x10;
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    pcVar4[0x10] = '\0';
    std::__cxx11::string::assign(pcVar4);
    *(int *)(pcVar4 + 0x20) = log_level;
    *(char **)(pcVar4 + 0x28) = vmodule_list;
    vmodule_list = pcVar4;
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)vmodule_lock);
  if (0 < *SetVLOGLevel::vlocal__) {
    if ((SetVLOGLevel::vlocal__ == &kLogSiteUninitialized) &&
       (bVar2 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
                            ,1), !bVar2)) {
      return iVar5;
    }
    RawLog__(0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
             ,0xc5,"Set VLOG level for \"%s\" to %d",module_pattern,log_level);
  }
  return iVar5;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  int const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    MutexLock l(&vmodule_lock);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list;
         info != NULL; info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found  &&
                 SafeFNMatch_(info->module_pattern.c_str(),
                              info->module_pattern.size(),
                              module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}